

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

bool __thiscall Analyzer::isSubnodeExistsInNode(Analyzer *this,Node *node,Node *subnode)

{
  bool bVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  bool bVar4;
  ulong uVar5;
  
  bVar1 = isNodeEquals(this,node,subnode);
  bVar4 = true;
  if (!bVar1) {
    ppNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar3 != ppNVar2) {
      uVar5 = 0;
      do {
        if (ppNVar2[uVar5] != (Node *)0x0) {
          bVar1 = isSubnodeExistsInNode(this,ppNVar2[uVar5],subnode);
          if (bVar1) {
            return true;
          }
          ppNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)ppNVar3 - (long)ppNVar2 >> 3));
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isSubnodeExistsInNode(Node * node, Node * subnode)
  {
    if (isNodeEquals(node, subnode))
      return true;

    for (size_t i = 0; i < node->children.size(); i++)
      if (node->children[i])
        if (isSubnodeExistsInNode(node->children[i], subnode))
          return true;

    return false;
  }